

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void LiteScript::State::Save(ostream *stream,State *state)

{
  OStreamer *pOVar1;
  Object *pOVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  Variable *pVVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference this;
  uint local_bc;
  uint sz_4;
  uint i_6;
  uint local_b0;
  uint local_ac;
  uint sz_3;
  uint i_5;
  uint local_a0;
  uint local_9c;
  uint sz_2;
  uint i_4;
  uchar local_8a [2];
  uint local_88;
  uint local_84;
  uint sz_1;
  uint i_3;
  uchar local_72 [2];
  uint local_70;
  uint local_6c;
  uint sz;
  uint i_2;
  uint local_60;
  uint local_5c;
  uint sz_j_1;
  uint j_1;
  uint local_50;
  uint local_4c;
  uint sz_i_1;
  uint i_1;
  uint local_40;
  uint local_3c;
  uint sz_j;
  uint j;
  uint local_30;
  uint local_2c;
  uint sz_i;
  uint i;
  OStreamer local_20;
  OStreamer streamer;
  State *state_local;
  ostream *stream_local;
  
  streamer.stream = (ostream *)state;
  OStreamer::OStreamer(&local_20,stream);
  pOVar1 = OStreamer::operator<<(&local_20,(uint *)(streamer.stream + 0x18));
  OStreamer::operator<<(pOVar1,(uint *)(streamer.stream + 0x1c));
  pOVar2 = Variable::operator->((Variable *)(streamer.stream + 0x20));
  OStreamer::operator<<(&local_20,&pOVar2->ID);
  _sz_i = std::
          vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
          ::size((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                  *)(streamer.stream + 0x30));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz_i);
  local_2c = 0;
  sVar3 = std::
          vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
          ::size((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                  *)(streamer.stream + 0x30));
  local_30 = (uint)sVar3;
  for (; local_2c < local_30; local_2c = local_2c + 1) {
    pvVar4 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::operator[]((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                           *)(streamer.stream + 0x30),(ulong)local_2c);
    _sz_j = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar4);
    OStreamer::operator<<(&local_20,(unsigned_long *)&sz_j);
    local_3c = 0;
    pvVar4 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::operator[]((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                           *)(streamer.stream + 0x30),(ulong)local_2c);
    sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar4);
    local_40 = (uint)sVar3;
    for (; local_3c < local_40; local_3c = local_3c + 1) {
      pvVar4 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::operator[]((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                             *)(streamer.stream + 0x30),(ulong)local_2c);
      pvVar5 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                         (pvVar4,(ulong)local_3c);
      pOVar2 = Variable::operator->(pvVar5);
      OStreamer::operator<<(&local_20,&pOVar2->ID);
    }
  }
  _sz_i_1 = std::
            vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
            ::size((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                    *)(streamer.stream + 0x48));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz_i_1);
  local_4c = 0;
  sVar3 = std::
          vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
          ::size((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                  *)(streamer.stream + 0x48));
  local_50 = (uint)sVar3;
  for (; local_4c < local_50; local_4c = local_4c + 1) {
    pvVar4 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::operator[]((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                           *)(streamer.stream + 0x48),(ulong)local_4c);
    _sz_j_1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar4)
    ;
    OStreamer::operator<<(&local_20,(unsigned_long *)&sz_j_1);
    local_5c = 0;
    pvVar4 = std::
             vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ::operator[]((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                           *)(streamer.stream + 0x48),(ulong)local_4c);
    sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size(pvVar4);
    local_60 = (uint)sVar3;
    for (; local_5c < local_60; local_5c = local_5c + 1) {
      pvVar4 = std::
               vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ::operator[]((vector<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                             *)(streamer.stream + 0x48),(ulong)local_4c);
      pvVar5 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                         (pvVar4,(ulong)local_5c);
      pOVar2 = Variable::operator->(pvVar5);
      OStreamer::operator<<(&local_20,&pOVar2->ID);
    }
  }
  _sz = std::
        vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
        ::size((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                *)(streamer.stream + 0x60));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz);
  local_6c = 0;
  sVar3 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                  *)(streamer.stream + 0x60));
  local_70 = (uint)sVar3;
  for (; local_6c < local_70; local_6c = local_6c + 1) {
    pvVar6 = std::
             vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ::operator[]((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                           *)(streamer.stream + 0x60),(ulong)local_6c);
    if ((*pvVar6->isNull & 1U) == 0) {
      local_72[0] = '\x01';
      pOVar1 = OStreamer::operator<<(&local_20,local_72);
      pvVar6 = std::
               vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ::operator[]((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                             *)(streamer.stream + 0x60),(ulong)local_6c);
      pVVar7 = Nullable<LiteScript::Variable>::operator*(pvVar6);
      pOVar2 = Variable::operator->(pVVar7);
      OStreamer::operator<<(pOVar1,&pOVar2->ID);
    }
    else {
      local_72[1] = 0;
      OStreamer::operator<<(&local_20,local_72 + 1);
    }
  }
  _sz_1 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                  *)(streamer.stream + 0x78));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz_1);
  local_84 = 0;
  sVar3 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                  *)(streamer.stream + 0x78));
  local_88 = (uint)sVar3;
  for (; local_84 < local_88; local_84 = local_84 + 1) {
    pvVar6 = std::
             vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ::operator[]((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                           *)(streamer.stream + 0x78),(ulong)local_84);
    if ((*pvVar6->isNull & 1U) == 0) {
      local_8a[0] = '\x01';
      pOVar1 = OStreamer::operator<<(&local_20,local_8a);
      pvVar6 = std::
               vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ::operator[]((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                             *)(streamer.stream + 0x78),(ulong)local_84);
      pVVar7 = Nullable<LiteScript::Variable>::operator*(pvVar6);
      pOVar2 = Variable::operator->(pVVar7);
      OStreamer::operator<<(pOVar1,&pOVar2->ID);
    }
    else {
      local_8a[1] = 0;
      OStreamer::operator<<(&local_20,local_8a + 1);
    }
  }
  _sz_2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                     (streamer.stream + 0x90));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz_2);
  local_9c = 0;
  sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                     (streamer.stream + 0x90));
  local_a0 = (uint)sVar3;
  for (; local_9c < local_a0; local_9c = local_9c + 1) {
    pvVar5 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                       ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                        (streamer.stream + 0x90),(ulong)local_9c);
    pOVar2 = Variable::operator->(pvVar5);
    OStreamer::operator<<(&local_20,&pOVar2->ID);
  }
  _sz_3 = std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          size((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                *)(streamer.stream + 0xa8));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz_3);
  local_ac = 0;
  sVar3 = std::
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
          size((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                *)(streamer.stream + 0xa8));
  local_b0 = (uint)sVar3;
  for (; local_ac < local_b0; local_ac = local_ac + 1) {
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[]((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                           *)(streamer.stream + 0xa8),(ulong)local_ac);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,0);
    pOVar1 = OStreamer::operator<<(&local_20,pvVar9);
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[]((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                           *)(streamer.stream + 0xa8),(ulong)local_ac);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,1);
    OStreamer::operator<<(pOVar1,pvVar9);
  }
  _sz_4 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::size
                    ((vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *)
                     (streamer.stream + 0xc0));
  OStreamer::operator<<(&local_20,(unsigned_long *)&sz_4);
  local_bc = 0;
  sVar3 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::size
                    ((vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *)
                     (streamer.stream + 0xc0));
  for (; local_bc < (uint)sVar3; local_bc = local_bc + 1) {
    this = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::operator[]
                     ((vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *)
                      (streamer.stream + 0xc0),(ulong)local_bc);
    Namer::SaveIDs(this,stream);
  }
  return;
}

Assistant:

void LiteScript::State::Save(std::ostream &stream, const State &state) {
    OStreamer streamer(stream);
    streamer << state.instr_index << state.line_num;
    streamer << state.nsp_global->ID;
    streamer << state.args_tmp.size();
    for (unsigned int i = 0, sz_i = state.args_tmp.size(); i < sz_i; i++) {
        streamer << state.args_tmp[i].size();
        for (unsigned int j = 0, sz_j = state.args_tmp[i].size(); j < sz_j; j++)
            streamer << state.args_tmp[i][j]->ID;
    }
    streamer << state.args_def.size();
    for (unsigned int i = 0, sz_i = state.args_def.size(); i < sz_i; i++) {
        streamer << state.args_def[i].size();
        for (unsigned int j = 0, sz_j = state.args_def[i].size(); j < sz_j; j++)
            streamer << state.args_def[i][j]->ID;
    }
    streamer << state.ths.size();
    for (unsigned int i = 0, sz = state.ths.size(); i < sz; i++) {
        if (state.ths[i].isNull)
            streamer << (unsigned char)0;
        else
            streamer << (unsigned char)1 << (*state.ths[i])->ID;
    }
    streamer << state.rets.size();
    for (unsigned int i = 0, sz = state.rets.size(); i < sz; i++) {
        if (state.rets[i].isNull)
            streamer << (unsigned char)0;
        else
            streamer << (unsigned char)1 << (*state.rets[i])->ID;
    }
    streamer << state.op_lifo.size();
    for (unsigned int i = 0, sz = state.op_lifo.size(); i < sz; i++)
        streamer << state.op_lifo[i]->ID;
    streamer << state.call_lifo.size();
    for (unsigned int i = 0, sz = state.call_lifo.size(); i < sz; i++)
        streamer << state.call_lifo[i][0] << state.call_lifo[i][1];
    streamer << state.nsp_lifo.size();
    for (unsigned int i = 0, sz = state.nsp_lifo.size(); i < sz; i++)
        state.nsp_lifo[i].SaveIDs(stream);
 }